

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  PS_Mask __dest;
  FT_UInt FVar1;
  undefined4 uVar2;
  PS_Mask pPVar3;
  byte *pbVar4;
  byte *pbVar5;
  FT_Byte *pFVar6;
  FT_Byte *pFVar7;
  bool bVar8;
  FT_UInt FVar9;
  FT_UInt FVar10;
  undefined4 uVar11;
  FT_Error FVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  long lVar22;
  ulong uVar23;
  undefined4 uStack_50;
  
  uVar13 = (ulong)(dim->masks).num_masks;
  if (uVar13 != 0) {
    (dim->masks).masks[uVar13 - 1].end_point = end_point;
  }
  FVar1 = (dim->counters).num_masks;
  if (1 < (long)(int)FVar1) {
    uVar23 = (ulong)(FVar1 - 2);
    uVar13 = (long)(int)FVar1;
    do {
      uVar17 = uVar13 - 1;
      pPVar3 = (dim->counters).masks;
      pbVar4 = pPVar3[uVar17].bytes;
      uVar14 = uVar23;
      while( true ) {
        pbVar5 = pPVar3[uVar14].bytes;
        uVar15 = pPVar3[uVar14].num_bits;
        if (pPVar3[uVar17].num_bits < pPVar3[uVar14].num_bits) {
          uVar15 = pPVar3[uVar17].num_bits;
        }
        uVar18 = (uint)uVar14;
        pbVar21 = pbVar5;
        pbVar19 = pbVar4;
        if (7 < uVar15) {
          uVar20 = (ulong)(uVar15 - 8 >> 3);
          pbVar19 = pbVar4 + uVar20 + 1;
          pbVar21 = pbVar5 + uVar20 + 1;
          lVar22 = 0;
          do {
            if ((pbVar4[lVar22] & pbVar5[lVar22]) != 0) goto LAB_00159021;
            uVar15 = uVar15 - 8;
            lVar22 = lVar22 + 1;
          } while (7 < uVar15);
        }
        if ((uVar15 != 0) && (0xffU >> ((byte)uVar15 & 0x1f) < (uint)(*pbVar21 & *pbVar19))) break;
        uVar14 = uVar14 - 1;
        if ((int)uVar18 < 1) goto LAB_00159173;
      }
LAB_00159021:
      uVar16 = (uint)uVar17;
      uVar15 = uVar16;
      if (uVar16 < uVar18) {
        uVar15 = uVar18;
      }
      if (uVar16 <= uVar18) {
        uVar14 = uVar17;
      }
      FVar12 = 0;
      if ((uVar15 <= (uint)uVar14) || ((dim->counters).num_masks <= uVar15)) goto LAB_0015916f;
      __dest = pPVar3 + uVar15;
      FVar1 = __dest->num_bits;
      if (FVar1 == 0) {
        FVar12 = 0;
        goto LAB_00159106;
      }
      pPVar3 = pPVar3 + (uVar14 & 0xffffffff);
      uVar18 = pPVar3->num_bits;
      if (FVar1 <= uVar18) goto LAB_001590cc;
      FVar12 = ps_mask_ensure(pPVar3,FVar1,memory);
      if (FVar12 == 0) {
        do {
          if (uVar18 < pPVar3->num_bits) {
            pPVar3->bytes[uVar18 >> 3] =
                 pPVar3->bytes[uVar18 >> 3] & (byte)(-0x81 >> ((byte)uVar18 & 7));
          }
          uVar18 = uVar18 + 1;
        } while (FVar1 != uVar18);
LAB_001590cc:
        bVar8 = true;
        FVar12 = 0;
        if (7 < FVar1 + 7) {
          pFVar6 = pPVar3->bytes;
          pFVar7 = __dest->bytes;
          lVar22 = 0;
          do {
            pFVar6[lVar22] = pFVar6[lVar22] | pFVar7[lVar22];
            lVar22 = lVar22 + 1;
          } while (FVar1 + 7 >> 3 != (uint)lVar22);
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
LAB_00159106:
        __dest->num_bits = 0;
        __dest->end_point = 0;
        uVar15 = ~uVar15 + (dim->counters).num_masks;
        if (0 < (int)uVar15) {
          FVar10 = __dest->end_point;
          uVar11 = *(undefined4 *)&__dest->field_0x14;
          FVar1 = __dest->num_bits;
          FVar9 = __dest->max_bits;
          uStack_50 = (undefined4)((ulong)*(undefined8 *)&__dest->max_bits >> 0x20);
          uVar2 = *(undefined4 *)((long)&__dest->bytes + 4);
          uVar14 = (ulong)uVar15;
          memmove(__dest,__dest + 1,uVar14 * 0x18);
          pPVar3 = __dest + uVar14;
          pPVar3->num_bits = FVar1;
          pPVar3->max_bits = FVar9;
          pPVar3->bytes = (FT_Byte *)CONCAT44(uVar2,uStack_50);
          __dest[uVar14].end_point = FVar10;
          *(undefined4 *)&__dest[uVar14].field_0x14 = uVar11;
        }
        (dim->counters).num_masks = (dim->counters).num_masks - 1;
      }
LAB_0015916f:
      if (FVar12 != 0) {
        return FVar12;
      }
LAB_00159173:
      uVar23 = uVar23 - 1;
      bVar8 = 2 < (long)uVar13;
      uVar13 = uVar17;
    } while (bVar8);
  }
  return 0;
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }